

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_CMap_New(FT_CMap_Class clazz,FT_Pointer init_data,FT_CharMap charmap,
                    FT_CMap_conflict *acmap)

{
  int iVar1;
  FT_Face pFVar2;
  FT_Memory pFVar3;
  size_t __n;
  FT_CMap_DoneFunc p_Var4;
  FT_Encoding FVar5;
  FT_UShort FVar6;
  FT_UShort FVar7;
  FT_CMap __s;
  FT_CharMap *ppFVar8;
  FT_Error FVar9;
  FT_Error local_34;
  
  if (charmap == (FT_CharMap)0x0 || clazz == (FT_CMap_Class)0x0) {
    return 6;
  }
  pFVar2 = charmap->face;
  if (pFVar2 == (FT_Face)0x0) {
    return 6;
  }
  pFVar3 = pFVar2->memory;
  __n = clazz->size;
  if ((long)__n < 1) {
    FVar9 = 6;
    __s = (FT_CMap_conflict)0x0;
    if (__n != 0) goto LAB_001ed136;
LAB_001ed0a6:
    local_34 = 0;
    FVar5 = charmap->encoding;
    FVar6 = charmap->platform_id;
    FVar7 = charmap->encoding_id;
    (__s->charmap).face = charmap->face;
    (__s->charmap).encoding = FVar5;
    (__s->charmap).platform_id = FVar6;
    (__s->charmap).encoding_id = FVar7;
    __s->clazz = clazz;
    if ((clazz->init == (FT_CMap_InitFunc)0x0) ||
       (local_34 = (*clazz->init)(__s,init_data), local_34 == 0)) {
      ppFVar8 = (FT_CharMap *)
                ft_mem_realloc(pFVar3,8,(long)pFVar2->num_charmaps,(long)pFVar2->num_charmaps + 1,
                               pFVar2->charmaps,&local_34);
      pFVar2->charmaps = ppFVar8;
      if (local_34 == 0) {
        iVar1 = pFVar2->num_charmaps;
        pFVar2->num_charmaps = iVar1 + 1;
        ppFVar8[iVar1] = &__s->charmap;
        FVar9 = 0;
        goto LAB_001ed136;
      }
    }
    FVar9 = local_34;
    pFVar3 = ((__s->charmap).face)->memory;
    p_Var4 = __s->clazz->done;
    if (p_Var4 != (FT_CMap_DoneFunc)0x0) {
      (*p_Var4)(__s);
    }
    (*pFVar3->free)(pFVar3,__s);
  }
  else {
    __s = (FT_CMap)(*pFVar3->alloc)(pFVar3,__n);
    if (__s != (FT_CMap)0x0) {
      memset(__s,0,__n);
      goto LAB_001ed0a6;
    }
    FVar9 = 0x40;
  }
  __s = (FT_CMap_conflict)0x0;
LAB_001ed136:
  if (acmap != (FT_CMap_conflict *)0x0) {
    *acmap = __s;
  }
  return FVar9;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_CMap_New( FT_CMap_Class  clazz,
               FT_Pointer     init_data,
               FT_CharMap     charmap,
               FT_CMap       *acmap )
  {
    FT_Error   error = FT_Err_Ok;
    FT_Face    face;
    FT_Memory  memory;
    FT_CMap    cmap = NULL;


    if ( !clazz || !charmap || !charmap->face )
      return FT_THROW( Invalid_Argument );

    face   = charmap->face;
    memory = FT_FACE_MEMORY( face );

    if ( !FT_ALLOC( cmap, clazz->size ) )
    {
      cmap->charmap = *charmap;
      cmap->clazz   = clazz;

      if ( clazz->init )
      {
        error = clazz->init( cmap, init_data );
        if ( error )
          goto Fail;
      }

      /* add it to our list of charmaps */
      if ( FT_RENEW_ARRAY( face->charmaps,
                           face->num_charmaps,
                           face->num_charmaps + 1 ) )
        goto Fail;

      face->charmaps[face->num_charmaps++] = (FT_CharMap)cmap;
    }

  Exit:
    if ( acmap )
      *acmap = cmap;

    return error;

  Fail:
    ft_cmap_done_internal( cmap );
    cmap = NULL;
    goto Exit;
  }